

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O3

float * r4mat_test(char trans,int lda,int m,int n)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  float *pfVar7;
  
  if (trans == 'N') {
    uVar3 = 0xffffffffffffffff;
    if (-1 < n * lda) {
      uVar3 = (ulong)(uint)(n * lda) * 4;
    }
    pfVar1 = (float *)operator_new__(uVar3);
    if (0 < n) {
      iVar2 = 0xb;
      uVar3 = 0;
      pfVar4 = pfVar1;
      do {
        if (0 < m) {
          uVar6 = 0;
          iVar5 = iVar2;
          do {
            pfVar4[uVar6] = (float)iVar5;
            uVar6 = uVar6 + 1;
            iVar5 = iVar5 + 10;
          } while ((uint)m != uVar6);
        }
        uVar3 = uVar3 + 1;
        pfVar4 = pfVar4 + lda;
        iVar2 = iVar2 + 1;
      } while (uVar3 != (uint)n);
    }
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < m * lda) {
      uVar3 = (ulong)(uint)(m * lda) * 4;
    }
    pfVar1 = (float *)operator_new__(uVar3);
    if (0 < n) {
      iVar2 = 0xb;
      uVar3 = 0;
      pfVar4 = pfVar1;
      do {
        uVar6 = (ulong)(uint)m;
        pfVar7 = pfVar4;
        iVar5 = iVar2;
        if (0 < m) {
          do {
            *pfVar7 = (float)iVar5;
            uVar6 = uVar6 - 1;
            pfVar7 = pfVar7 + lda;
            iVar5 = iVar5 + 10;
          } while (uVar6 != 0);
        }
        uVar3 = uVar3 + 1;
        pfVar4 = pfVar4 + 1;
        iVar2 = iVar2 + 1;
      } while (uVar3 != (uint)n);
    }
  }
  return pfVar1;
}

Assistant:

float *r4mat_test ( char trans, int lda, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    R4MAT_TEST sets up a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
// 
//  Modified:
//
//    10 February 2014
//
//  Author:
//
//    John Burkardt.
//
//  Parameters:
//
//    Input, char TRANS, indicates whether matrix is to be transposed.
//    'N', no transpose.
//    'T', transpose the matrix.
//
//    Input, int LDA, the leading dimension of the matrix.
//
//    Input, int M, N, the number of rows and columns of the matrix.
//
//    Output, float R4MAT_TEST[LDA*?], the matrix.
//    if TRANS is 'N', then the matrix is stored in LDA*N entries,
//    as an M x N matrix;
//    if TRANS is 'T', then the matrix is stored in LDA*M entries,
//    as an N x M matrix.
//
{
  float *a;
  int i;
  int j;

  if ( trans == 'N' )
  {
    a = new float[lda*n];

    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        a[i+j*lda] = static_cast<float> ( 10 * ( i + 1 ) + ( j + 1 ) );
      }
    }
  }
  else
  {
    a = new float[lda*m];

    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        a[j+i*lda] = static_cast<float> ( 10 * ( i + 1 ) + ( j + 1 ) );
      }
    }
  }
  return a;
}